

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

void embree::avx::ConeCurveMiMBIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 uVar20;
  undefined4 uVar21;
  RayHitK<8> *pRVar22;
  uint uVar24;
  Scene *pSVar25;
  undefined1 (*pauVar26) [16];
  long lVar27;
  long lVar28;
  float fVar29;
  float fVar30;
  float fVar40;
  float fVar42;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar43;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar44;
  float fVar45;
  float fVar54;
  float fVar56;
  float fVar57;
  undefined1 auVar46 [16];
  float fVar55;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar78;
  float fVar79;
  undefined1 auVar74 [16];
  float fVar80;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar81;
  float fVar89;
  float fVar90;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  float fVar91;
  float fVar102;
  float fVar103;
  undefined1 auVar92 [16];
  float fVar104;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  float fVar121;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [16];
  float fVar129;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar130;
  float fVar138;
  float fVar139;
  undefined1 auVar131 [16];
  float fVar140;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [64];
  float fVar145;
  float fVar148;
  float fVar149;
  undefined1 auVar146 [16];
  float fVar150;
  undefined1 auVar147 [16];
  float fVar151;
  float fVar156;
  float fVar157;
  undefined1 auVar152 [16];
  float fVar158;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [64];
  float fVar161;
  undefined1 auVar159 [16];
  undefined1 auVar160 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4b0 [16];
  RayQueryContext *local_498;
  undefined1 (*local_490) [16];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  Scene *local_430;
  RayHitK<8> *local_428;
  undefined1 local_420 [16];
  undefined1 *local_410;
  void *local_408;
  RTCRayQueryContext *local_400;
  RayHitK<8> *local_3f8;
  undefined1 (*local_3f0) [32];
  undefined4 local_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 auStack_3d0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_2f0 [16];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  float local_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float local_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [16];
  undefined1 local_250 [8];
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined1 local_230 [8];
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float local_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar23;
  undefined1 auVar101 [64];
  
  pSVar25 = context->scene;
  uVar24 = line->sharedGeomID;
  uVar1 = (line->v0).field_0.i[0];
  pGVar5 = (pSVar25->geometries).items[uVar24].ptr;
  fVar81 = (pGVar5->time_range).lower;
  fVar81 = pGVar5->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar81) / ((pGVar5->time_range).upper - fVar81));
  auVar32 = vroundss_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),9);
  auVar32 = vminss_avx(auVar32,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar82 = vmaxss_avx(ZEXT816(0),auVar32);
  lVar27 = *(long *)&pGVar5[3].time_range.upper;
  lVar28 = (long)(int)auVar82._0_4_ * 0x38;
  lVar6 = *(long *)(lVar27 + lVar28);
  lVar7 = *(long *)(lVar27 + 0x10 + lVar28);
  auVar32 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar1);
  uVar2 = (line->v0).field_0.i[1];
  auVar35 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar2);
  uVar3 = (line->v0).field_0.i[2];
  auVar68 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar3);
  uVar4 = (line->v0).field_0.i[3];
  auVar33 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar4);
  auVar46 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)(uVar1 + 1));
  auVar58 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)(uVar2 + 1));
  auVar31 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)(uVar3 + 1));
  auVar47 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)(uVar4 + 1));
  lVar6 = *(long *)(lVar27 + 0x38 + lVar28);
  lVar27 = *(long *)(lVar27 + 0x48 + lVar28);
  auVar59 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar1 * lVar27);
  auVar60 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar2 * lVar27);
  auVar61 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar3 * lVar27);
  auVar69 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar4 * lVar27);
  auVar70 = *(undefined1 (*) [16])(lVar6 + (ulong)(uVar1 + 1) * lVar27);
  auVar74 = *(undefined1 (*) [16])(lVar6 + (ulong)(uVar3 + 1) * lVar27);
  fVar81 = fVar81 - auVar82._0_4_;
  auVar82 = vunpcklps_avx(auVar32,auVar68);
  auVar32 = vunpckhps_avx(auVar32,auVar68);
  auVar68 = vunpcklps_avx(auVar35,auVar33);
  auVar35 = vunpckhps_avx(auVar35,auVar33);
  auVar92 = vunpcklps_avx(auVar82,auVar68);
  auVar68 = vunpckhps_avx(auVar82,auVar68);
  auVar82 = vunpcklps_avx(auVar32,auVar35);
  auVar33 = vunpckhps_avx(auVar32,auVar35);
  auVar105 = vunpcklps_avx(auVar46,auVar31);
  auVar32 = vunpckhps_avx(auVar46,auVar31);
  auVar46 = vunpcklps_avx(auVar58,auVar47);
  auVar35 = vunpckhps_avx(auVar58,auVar47);
  auVar106 = vunpcklps_avx(auVar105,auVar46);
  auVar46 = vunpckhps_avx(auVar105,auVar46);
  auVar105 = vunpcklps_avx(auVar32,auVar35);
  auVar58 = vunpckhps_avx(auVar32,auVar35);
  auVar31 = vunpcklps_avx(auVar59,auVar61);
  auVar32 = vunpckhps_avx(auVar59,auVar61);
  auVar47 = vunpcklps_avx(auVar60,auVar69);
  auVar35 = vunpckhps_avx(auVar60,auVar69);
  auVar61 = vunpcklps_avx(auVar31,auVar47);
  auVar31 = vunpckhps_avx(auVar31,auVar47);
  auVar69 = vunpcklps_avx(auVar32,auVar35);
  auVar47 = vunpckhps_avx(auVar32,auVar35);
  auVar60 = vunpcklps_avx(auVar70,auVar74);
  auVar59 = vunpckhps_avx(auVar70,auVar74);
  auVar32 = *(undefined1 (*) [16])(lVar6 + (ulong)(uVar2 + 1) * lVar27);
  auVar35 = *(undefined1 (*) [16])(lVar6 + lVar27 * (ulong)(uVar4 + 1));
  auVar70 = vunpcklps_avx(auVar32,auVar35);
  auVar32 = vunpckhps_avx(auVar32,auVar35);
  auVar74 = vunpcklps_avx(auVar60,auVar70);
  auVar60 = vunpckhps_avx(auVar60,auVar70);
  auVar70 = vunpcklps_avx(auVar59,auVar32);
  auVar59 = vunpckhps_avx(auVar59,auVar32);
  auVar32 = vshufps_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),0);
  auVar35 = vshufps_avx(ZEXT416((uint)(1.0 - fVar81)),ZEXT416((uint)(1.0 - fVar81)),0);
  fVar54 = auVar32._0_4_;
  fVar56 = auVar32._4_4_;
  fVar57 = auVar32._8_4_;
  fVar161 = auVar32._12_4_;
  local_4d0._0_4_ = auVar92._0_4_;
  local_4d0._4_4_ = auVar92._4_4_;
  fStack_4c8 = auVar92._8_4_;
  fStack_4c4 = auVar92._12_4_;
  fVar81 = auVar35._0_4_;
  fVar89 = auVar35._4_4_;
  fVar90 = auVar35._8_4_;
  fVar44 = auVar35._12_4_;
  auVar152._0_4_ = fVar81 * (float)local_4d0._0_4_ + fVar54 * auVar61._0_4_;
  auVar152._4_4_ = fVar89 * (float)local_4d0._4_4_ + fVar56 * auVar61._4_4_;
  auVar152._8_4_ = fVar90 * fStack_4c8 + fVar57 * auVar61._8_4_;
  auVar152._12_4_ = fVar44 * fStack_4c4 + fVar161 * auVar61._12_4_;
  auVar92._0_4_ = auVar68._0_4_ * fVar81 + fVar54 * auVar31._0_4_;
  auVar92._4_4_ = auVar68._4_4_ * fVar89 + fVar56 * auVar31._4_4_;
  auVar92._8_4_ = auVar68._8_4_ * fVar90 + fVar57 * auVar31._8_4_;
  auVar92._12_4_ = auVar68._12_4_ * fVar44 + fVar161 * auVar31._12_4_;
  auVar141._0_4_ = auVar82._0_4_ * fVar81 + fVar54 * auVar69._0_4_;
  auVar141._4_4_ = auVar82._4_4_ * fVar89 + fVar56 * auVar69._4_4_;
  auVar141._8_4_ = auVar82._8_4_ * fVar90 + fVar57 * auVar69._8_4_;
  auVar141._12_4_ = auVar82._12_4_ * fVar44 + fVar161 * auVar69._12_4_;
  auVar162._8_4_ = 0x3f800000;
  auVar162._0_8_ = 0x3f8000003f800000;
  auVar162._12_4_ = 0x3f800000;
  local_4d0._0_4_ = fVar81 * auVar33._0_4_ + fVar54 * auVar47._0_4_;
  local_4d0._4_4_ = fVar89 * auVar33._4_4_ + fVar56 * auVar47._4_4_;
  fStack_4c8 = fVar90 * auVar33._8_4_ + fVar57 * auVar47._8_4_;
  fStack_4c4 = fVar44 * auVar33._12_4_ + fVar161 * auVar47._12_4_;
  auVar131._0_4_ = auVar106._0_4_ * fVar81 + fVar54 * auVar74._0_4_;
  auVar131._4_4_ = auVar106._4_4_ * fVar89 + fVar56 * auVar74._4_4_;
  auVar131._8_4_ = auVar106._8_4_ * fVar90 + fVar57 * auVar74._8_4_;
  auVar131._12_4_ = auVar106._12_4_ * fVar44 + fVar161 * auVar74._12_4_;
  auVar146._0_4_ = auVar46._0_4_ * fVar81 + fVar54 * auVar60._0_4_;
  auVar146._4_4_ = auVar46._4_4_ * fVar89 + fVar56 * auVar60._4_4_;
  auVar146._8_4_ = auVar46._8_4_ * fVar90 + fVar57 * auVar60._8_4_;
  auVar146._12_4_ = auVar46._12_4_ * fVar44 + fVar161 * auVar60._12_4_;
  local_440._0_4_ = auVar105._0_4_;
  local_440._4_4_ = auVar105._4_4_;
  fStack_438 = auVar105._8_4_;
  fStack_434 = auVar105._12_4_;
  auVar122._0_4_ = fVar81 * (float)local_440._0_4_ + fVar54 * auVar70._0_4_;
  auVar122._4_4_ = fVar89 * (float)local_440._4_4_ + fVar56 * auVar70._4_4_;
  auVar122._8_4_ = fVar90 * fStack_438 + fVar57 * auVar70._8_4_;
  auVar122._12_4_ = fVar44 * fStack_434 + fVar161 * auVar70._12_4_;
  local_3e0._0_4_ = auVar58._0_4_;
  local_3e0._4_4_ = auVar58._4_4_;
  fStack_3d8 = auVar58._8_4_;
  fStack_3d4 = auVar58._12_4_;
  auVar31._0_4_ = fVar81 * (float)local_3e0._0_4_ + fVar54 * auVar59._0_4_;
  auVar31._4_4_ = fVar89 * (float)local_3e0._4_4_ + fVar56 * auVar59._4_4_;
  auVar31._8_4_ = fVar90 * fStack_3d8 + fVar57 * auVar59._8_4_;
  auVar31._12_4_ = fVar44 * fStack_3d4 + fVar161 * auVar59._12_4_;
  auVar32 = vpcmpeqd_avx(auVar31,auVar31);
  auVar35 = vpcmpeqd_avx(auVar32,(undefined1  [16])(line->primIDs).field_0);
  local_220 = vshufps_avx(ZEXT416(uVar24),ZEXT416(uVar24),0);
  local_3e0._4_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
  local_240 = *(float *)(ray + k * 4 + 0xa0);
  local_2b0 = *(float *)(ray + k * 4 + 0xc0);
  auVar32 = ZEXT416((uint)((float)local_3e0._4_4_ * (float)local_3e0._4_4_ +
                          local_240 * local_240 + local_2b0 * local_2b0));
  auVar68 = vshufps_avx(auVar32,auVar32,0);
  auVar32 = vrcpps_avx(auVar68);
  fVar44 = auVar32._0_4_;
  auVar33._0_4_ = fVar44 * auVar68._0_4_;
  fVar54 = auVar32._4_4_;
  auVar33._4_4_ = fVar54 * auVar68._4_4_;
  fVar56 = auVar32._8_4_;
  auVar33._8_4_ = fVar56 * auVar68._8_4_;
  fVar57 = auVar32._12_4_;
  auVar33._12_4_ = fVar57 * auVar68._12_4_;
  auVar32 = vsubps_avx(auVar162,auVar33);
  auVar46._0_4_ = (auVar152._0_4_ + auVar131._0_4_) * 0.5;
  auVar46._4_4_ = (auVar152._4_4_ + auVar131._4_4_) * 0.5;
  auVar46._8_4_ = (auVar152._8_4_ + auVar131._8_4_) * 0.5;
  auVar46._12_4_ = (auVar152._12_4_ + auVar131._12_4_) * 0.5;
  auVar68._0_4_ = (auVar146._0_4_ + auVar92._0_4_) * 0.5;
  auVar68._4_4_ = (auVar146._4_4_ + auVar92._4_4_) * 0.5;
  auVar68._8_4_ = (auVar146._8_4_ + auVar92._8_4_) * 0.5;
  auVar68._12_4_ = (auVar146._12_4_ + auVar92._12_4_) * 0.5;
  auVar58._0_4_ = (auVar141._0_4_ + auVar122._0_4_) * 0.5;
  auVar58._4_4_ = (auVar141._4_4_ + auVar122._4_4_) * 0.5;
  auVar58._8_4_ = (auVar141._8_4_ + auVar122._8_4_) * 0.5;
  auVar58._12_4_ = (auVar141._12_4_ + auVar122._12_4_) * 0.5;
  fVar81 = *(float *)(ray + k * 4 + 0x20);
  auVar74._4_4_ = fVar81;
  auVar74._0_4_ = fVar81;
  auVar74._8_4_ = fVar81;
  auVar74._12_4_ = fVar81;
  auVar68 = vsubps_avx(auVar68,auVar74);
  fVar89 = *(float *)(ray + k * 4 + 0x40);
  auVar82._4_4_ = fVar89;
  auVar82._0_4_ = fVar89;
  auVar82._8_4_ = fVar89;
  auVar82._12_4_ = fVar89;
  auVar33 = vsubps_avx(auVar58,auVar82);
  fVar90 = *(float *)(ray + k * 4);
  auVar69._4_4_ = fVar90;
  auVar69._0_4_ = fVar90;
  auVar69._8_4_ = fVar90;
  auVar69._12_4_ = fVar90;
  auVar46 = vsubps_avx(auVar46,auVar69);
  fVar45 = (auVar46._0_4_ * (float)local_3e0._4_4_ +
           local_240 * auVar68._0_4_ + local_2b0 * auVar33._0_4_) *
           (fVar44 + fVar44 * auVar32._0_4_);
  fVar55 = (auVar46._4_4_ * (float)local_3e0._4_4_ +
           local_240 * auVar68._4_4_ + local_2b0 * auVar33._4_4_) *
           (fVar54 + fVar54 * auVar32._4_4_);
  fStack_488 = (auVar46._8_4_ * (float)local_3e0._4_4_ +
               local_240 * auVar68._8_4_ + local_2b0 * auVar33._8_4_) *
               (fVar56 + fVar56 * auVar32._8_4_);
  fStack_484 = (auVar46._12_4_ * (float)local_3e0._4_4_ +
               local_240 * auVar68._12_4_ + local_2b0 * auVar33._12_4_) *
               (fVar57 + fVar57 * auVar32._12_4_);
  auVar59._0_4_ = fVar90 + (float)local_3e0._4_4_ * fVar45;
  auVar59._4_4_ = fVar90 + (float)local_3e0._4_4_ * fVar55;
  auVar59._8_4_ = fVar90 + (float)local_3e0._4_4_ * fStack_488;
  auVar59._12_4_ = fVar90 + (float)local_3e0._4_4_ * fStack_484;
  auVar70._0_4_ = fVar81 + local_240 * fVar45;
  auVar70._4_4_ = fVar81 + local_240 * fVar55;
  auVar70._8_4_ = fVar81 + local_240 * fStack_488;
  auVar70._12_4_ = fVar81 + local_240 * fStack_484;
  auVar163._0_4_ = fVar89 + local_2b0 * fVar45;
  auVar163._4_4_ = fVar89 + local_2b0 * fVar55;
  auVar163._8_4_ = fVar89 + local_2b0 * fStack_488;
  auVar163._12_4_ = fVar89 + local_2b0 * fStack_484;
  local_260 = vsubps_avx(auVar146,auVar92);
  local_2c0 = vsubps_avx(auVar122,auVar141);
  fVar81 = local_2c0._0_4_;
  fVar56 = local_2c0._4_4_;
  fVar10 = local_2c0._8_4_;
  fVar14 = local_2c0._12_4_;
  fVar89 = local_260._0_4_;
  fVar57 = local_260._4_4_;
  fVar11 = local_260._8_4_;
  fVar15 = local_260._12_4_;
  auVar68 = vsubps_avx(auVar131,auVar152);
  fVar90 = auVar68._0_4_;
  fVar161 = auVar68._4_4_;
  fVar12 = auVar68._8_4_;
  fVar16 = auVar68._12_4_;
  fVar29 = fVar90 * fVar90 + fVar89 * fVar89 + fVar81 * fVar81;
  fVar40 = fVar161 * fVar161 + fVar57 * fVar57 + fVar56 * fVar56;
  fVar42 = fVar12 * fVar12 + fVar11 * fVar11 + fVar10 * fVar10;
  fVar43 = fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14;
  _local_440 = vsubps_avx(auVar70,auVar92);
  local_2d0 = vsubps_avx(auVar163,auVar141);
  fVar130 = local_2d0._0_4_;
  fVar138 = local_2d0._4_4_;
  fVar139 = local_2d0._8_4_;
  fVar140 = local_2d0._12_4_;
  fVar44 = local_440._0_4_;
  fVar8 = local_440._4_4_;
  fVar13 = local_440._8_4_;
  fVar17 = local_440._12_4_;
  _local_250 = vsubps_avx(auVar59,auVar152);
  fVar151 = local_250._0_4_;
  fVar156 = local_250._4_4_;
  fVar157 = local_250._8_4_;
  fVar158 = local_250._12_4_;
  fVar145 = fVar151 * fVar90 + fVar89 * fVar44 + fVar130 * fVar81;
  fVar148 = fVar156 * fVar161 + fVar57 * fVar8 + fVar138 * fVar56;
  fVar149 = fVar157 * fVar12 + fVar11 * fVar13 + fVar139 * fVar10;
  fVar150 = fVar158 * fVar16 + fVar15 * fVar17 + fVar140 * fVar14;
  auVar142._0_4_ = fVar90 * (float)local_3e0._4_4_ + local_240 * fVar89 + local_2b0 * fVar81;
  auVar142._4_4_ = fVar161 * (float)local_3e0._4_4_ + local_240 * fVar57 + local_2b0 * fVar56;
  auVar142._8_4_ = fVar12 * (float)local_3e0._4_4_ + local_240 * fVar11 + local_2b0 * fVar10;
  auVar142._12_4_ = fVar16 * (float)local_3e0._4_4_ + local_240 * fVar15 + local_2b0 * fVar14;
  fStack_2ac = local_2b0;
  fStack_2a8 = local_2b0;
  fStack_2a4 = local_2b0;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  local_3e0._0_4_ = local_3e0._4_4_;
  fStack_3d8 = (float)local_3e0._4_4_;
  fStack_3d4 = (float)local_3e0._4_4_;
  auVar32 = vsubps_avx(_local_4d0,auVar31);
  fVar54 = auVar32._0_4_;
  fVar9 = auVar32._4_4_;
  fVar30 = auVar32._8_4_;
  fVar41 = auVar32._12_4_;
  fVar73 = fVar54 * fVar54 + fVar29;
  fVar78 = fVar9 * fVar9 + fVar40;
  fVar79 = fVar30 * fVar30 + fVar42;
  fVar80 = fVar41 * fVar41 + fVar43;
  local_230._0_4_ = fVar29 * fVar29;
  local_230._4_4_ = fVar40 * fVar40;
  fStack_228 = fVar42 * fVar42;
  fStack_224 = fVar43 * fVar43;
  auVar32._0_4_ =
       (float)local_230._0_4_ *
       (fVar151 * (float)local_3e0._4_4_ + local_240 * fVar44 + local_2b0 * fVar130);
  auVar32._4_4_ =
       (float)local_230._4_4_ *
       (fVar156 * (float)local_3e0._4_4_ + local_240 * fVar8 + local_2b0 * fVar138);
  auVar32._8_4_ =
       fStack_228 * (fVar157 * (float)local_3e0._4_4_ + local_240 * fVar13 + local_2b0 * fVar139);
  auVar32._12_4_ =
       fStack_224 * (fVar158 * (float)local_3e0._4_4_ + local_240 * fVar17 + local_2b0 * fVar140);
  auVar105._0_4_ = fVar73 * auVar142._0_4_ * fVar145;
  auVar105._4_4_ = fVar78 * auVar142._4_4_ * fVar148;
  auVar105._8_4_ = fVar79 * auVar142._8_4_ * fVar149;
  auVar105._12_4_ = fVar80 * auVar142._12_4_ * fVar150;
  auVar32 = vsubps_avx(auVar32,auVar105);
  auVar106._0_4_ = (float)local_4d0._0_4_ * fVar29;
  auVar106._4_4_ = (float)local_4d0._4_4_ * fVar40;
  auVar106._8_4_ = fStack_4c8 * fVar42;
  auVar106._12_4_ = fStack_4c4 * fVar43;
  auVar47._0_4_ = auVar142._0_4_ * fVar54 * auVar106._0_4_ + auVar32._0_4_;
  auVar47._4_4_ = auVar142._4_4_ * fVar9 * auVar106._4_4_ + auVar32._4_4_;
  auVar47._8_4_ = auVar142._8_4_ * fVar30 * auVar106._8_4_ + auVar32._8_4_;
  auVar47._12_4_ = auVar142._12_4_ * fVar41 * auVar106._12_4_ + auVar32._12_4_;
  auVar60._0_4_ = (float)local_230._0_4_ * (fVar151 * fVar151 + fVar44 * fVar44 + fVar130 * fVar130)
  ;
  auVar60._4_4_ = (float)local_230._4_4_ * (fVar156 * fVar156 + fVar8 * fVar8 + fVar138 * fVar138);
  auVar60._8_4_ = fStack_228 * (fVar157 * fVar157 + fVar13 * fVar13 + fVar139 * fVar139);
  auVar60._12_4_ = fStack_224 * (fVar158 * fVar158 + fVar17 * fVar17 + fVar140 * fVar140);
  auVar116._0_4_ = fVar145 * fVar145 * fVar73;
  auVar116._4_4_ = fVar148 * fVar148 * fVar78;
  auVar116._8_4_ = fVar149 * fVar149 * fVar79;
  auVar116._12_4_ = fVar150 * fVar150 * fVar80;
  auVar32 = vsubps_avx(auVar60,auVar116);
  auVar117._0_4_ = (fVar54 + fVar54) * fVar145;
  auVar117._4_4_ = (fVar9 + fVar9) * fVar148;
  auVar117._8_4_ = (fVar30 + fVar30) * fVar149;
  auVar117._12_4_ = (fVar41 + fVar41) * fVar150;
  auVar33 = vsubps_avx(auVar117,auVar106);
  fVar91 = auVar142._0_4_ * auVar142._0_4_;
  fVar102 = auVar142._4_4_ * auVar142._4_4_;
  fVar103 = auVar142._8_4_ * auVar142._8_4_;
  fVar104 = auVar142._12_4_ * auVar142._12_4_;
  auVar61._0_4_ = fVar73 * fVar91;
  auVar61._4_4_ = fVar78 * fVar102;
  auVar61._8_4_ = fVar79 * fVar103;
  auVar61._12_4_ = fVar80 * fVar104;
  auVar46 = vsubps_avx(_local_230,auVar61);
  auVar107._0_4_ = auVar46._0_4_ * (auVar32._0_4_ + auVar33._0_4_ * auVar106._0_4_);
  auVar107._4_4_ = auVar46._4_4_ * (auVar32._4_4_ + auVar33._4_4_ * auVar106._4_4_);
  auVar107._8_4_ = auVar46._8_4_ * (auVar32._8_4_ + auVar33._8_4_ * auVar106._8_4_);
  auVar107._12_4_ = auVar46._12_4_ * (auVar32._12_4_ + auVar33._12_4_ * auVar106._12_4_);
  auVar118._0_4_ = auVar47._0_4_ * auVar47._0_4_;
  auVar118._4_4_ = auVar47._4_4_ * auVar47._4_4_;
  auVar118._8_4_ = auVar47._8_4_ * auVar47._8_4_;
  auVar118._12_4_ = auVar47._12_4_ * auVar47._12_4_;
  auVar33 = vsubps_avx(auVar118,auVar107);
  auVar60 = ZEXT416(0) << 0x20;
  auVar32 = vcmpps_avx(auVar33,auVar60,5);
  auVar58 = auVar32 & ~auVar35;
  if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar58[0xf] < '\0') {
    auVar58 = vandnps_avx(auVar35,auVar32);
    auVar59 = vsubps_avx(auVar59,auVar131);
    auVar61 = vsubps_avx(auVar70,auVar146);
    auVar69 = vsubps_avx(auVar163,auVar122);
    auVar32 = vrcpps_avx(auVar46);
    fVar121 = auVar32._0_4_;
    auVar132._0_4_ = fVar121 * auVar46._0_4_;
    fVar127 = auVar32._4_4_;
    auVar132._4_4_ = fVar127 * auVar46._4_4_;
    fVar128 = auVar32._8_4_;
    auVar132._8_4_ = fVar128 * auVar46._8_4_;
    fVar129 = auVar32._12_4_;
    auVar132._12_4_ = fVar129 * auVar46._12_4_;
    auVar164._8_4_ = 0x3f800000;
    auVar164._0_8_ = 0x3f8000003f800000;
    auVar164._12_4_ = 0x3f800000;
    auVar32 = vsubps_avx(auVar164,auVar132);
    fVar121 = fVar121 + fVar121 * auVar32._0_4_;
    fVar127 = fVar127 + fVar127 * auVar32._4_4_;
    fVar128 = fVar128 + fVar128 * auVar32._8_4_;
    fVar129 = fVar129 + fVar129 * auVar32._12_4_;
    auVar133._8_4_ = 0x7fffffff;
    auVar133._0_8_ = 0x7fffffff7fffffff;
    auVar133._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx(auVar133,auVar46);
    auVar134._8_4_ = 0x219392ef;
    auVar134._0_8_ = 0x219392ef219392ef;
    auVar134._12_4_ = 0x219392ef;
    auVar32 = vcmpps_avx(auVar32,auVar134,2);
    auVar35 = vsqrtps_avx(auVar33);
    uVar23 = CONCAT44(auVar47._4_4_,auVar47._0_4_);
    auVar135._0_8_ = uVar23 ^ 0x8000000080000000;
    auVar135._8_4_ = -auVar47._8_4_;
    auVar135._12_4_ = -auVar47._12_4_;
    auVar33 = vsubps_avx(auVar135,auVar35);
    auVar35 = vsubps_avx(auVar35,auVar47);
    auVar108._0_4_ = auVar33._0_4_ * fVar121;
    auVar108._4_4_ = auVar33._4_4_ * fVar127;
    auVar108._8_4_ = auVar33._8_4_ * fVar128;
    auVar108._12_4_ = auVar33._12_4_ * fVar129;
    auVar48._0_4_ = fVar121 * auVar35._0_4_;
    auVar48._4_4_ = fVar127 * auVar35._4_4_;
    auVar48._8_4_ = fVar128 * auVar35._8_4_;
    auVar48._12_4_ = fVar129 * auVar35._12_4_;
    auVar34._8_4_ = 0xff800000;
    auVar34._0_8_ = 0xff800000ff800000;
    auVar34._12_4_ = 0xff800000;
    auVar35 = vblendvps_avx(auVar108,auVar34,auVar32);
    auVar153._8_4_ = 0x7f800000;
    auVar153._0_8_ = 0x7f8000007f800000;
    auVar153._12_4_ = 0x7f800000;
    auVar33 = vblendvps_avx(auVar48,auVar153,auVar32);
    auVar123._0_4_ = fVar145 + auVar142._0_4_ * auVar35._0_4_;
    auVar123._4_4_ = fVar148 + auVar142._4_4_ * auVar35._4_4_;
    auVar123._8_4_ = fVar149 + auVar142._8_4_ * auVar35._8_4_;
    auVar123._12_4_ = fVar150 + auVar142._12_4_ * auVar35._12_4_;
    auVar32 = vcmpps_avx(auVar123,auVar60,6);
    auVar18._4_4_ = fVar40;
    auVar18._0_4_ = fVar29;
    auVar18._8_4_ = fVar42;
    auVar18._12_4_ = fVar43;
    auVar46 = vcmpps_avx(auVar123,auVar18,1);
    auVar32 = vandps_avx(auVar46,auVar32);
    auVar32 = vandps_avx(auVar58,auVar32);
    local_2f0 = vblendvps_avx(auVar153,auVar35,auVar32);
    auVar154._0_4_ = fVar145 + auVar142._0_4_ * auVar33._0_4_;
    auVar154._4_4_ = fVar148 + auVar142._4_4_ * auVar33._4_4_;
    auVar154._8_4_ = fVar149 + auVar142._8_4_ * auVar33._8_4_;
    auVar154._12_4_ = fVar150 + auVar142._12_4_ * auVar33._12_4_;
    auVar32 = vcmpps_avx(auVar154,auVar60,6);
    auVar35 = vcmpps_avx(auVar154,auVar18,1);
    auVar32 = vandps_avx(auVar35,auVar32);
    auVar32 = vandps_avx(auVar58,auVar32);
    local_420 = vblendvps_avx(auVar34,auVar33,auVar32);
    auVar32 = vrcpps_avx(auVar142);
    fVar121 = auVar32._0_4_;
    auVar62._0_4_ = auVar142._0_4_ * fVar121;
    fVar127 = auVar32._4_4_;
    auVar62._4_4_ = auVar142._4_4_ * fVar127;
    fVar128 = auVar32._8_4_;
    auVar62._8_4_ = auVar142._8_4_ * fVar128;
    fVar129 = auVar32._12_4_;
    auVar62._12_4_ = auVar142._12_4_ * fVar129;
    auVar32 = vsubps_avx(auVar164,auVar62);
    fVar121 = fVar121 + fVar121 * auVar32._0_4_;
    fVar127 = fVar127 + fVar127 * auVar32._4_4_;
    fVar128 = fVar128 + fVar128 * auVar32._8_4_;
    fVar129 = fVar129 + fVar129 * auVar32._12_4_;
    auVar63._0_4_ = auVar142._0_4_ * fVar151;
    auVar63._4_4_ = auVar142._4_4_ * fVar156;
    auVar63._8_4_ = auVar142._8_4_ * fVar157;
    auVar63._12_4_ = auVar142._12_4_ * fVar158;
    auVar93._0_4_ = (float)local_3e0._4_4_ * fVar145;
    auVar93._4_4_ = (float)local_3e0._4_4_ * fVar148;
    auVar93._8_4_ = (float)local_3e0._4_4_ * fVar149;
    auVar93._12_4_ = (float)local_3e0._4_4_ * fVar150;
    auVar32 = vsubps_avx(auVar63,auVar93);
    auVar94._0_4_ = auVar142._0_4_ * fVar44;
    auVar94._4_4_ = auVar142._4_4_ * fVar8;
    auVar94._8_4_ = auVar142._8_4_ * fVar13;
    auVar94._12_4_ = auVar142._12_4_ * fVar17;
    auVar109._0_4_ = local_240 * fVar145;
    auVar109._4_4_ = local_240 * fVar148;
    auVar109._8_4_ = local_240 * fVar149;
    auVar109._12_4_ = local_240 * fVar150;
    auVar35 = vsubps_avx(auVar94,auVar109);
    auVar110._0_4_ = auVar142._0_4_ * fVar130;
    auVar110._4_4_ = auVar142._4_4_ * fVar138;
    auVar110._8_4_ = auVar142._8_4_ * fVar139;
    auVar110._12_4_ = auVar142._12_4_ * fVar140;
    auVar159._0_4_ = fVar145 * local_2b0;
    auVar159._4_4_ = fVar148 * local_2b0;
    auVar159._8_4_ = fVar149 * local_2b0;
    auVar159._12_4_ = fVar150 * local_2b0;
    auVar33 = vsubps_avx(auVar110,auVar159);
    auVar64._0_4_ =
         auVar32._0_4_ * auVar32._0_4_ +
         auVar35._0_4_ * auVar35._0_4_ + auVar33._0_4_ * auVar33._0_4_;
    auVar64._4_4_ =
         auVar32._4_4_ * auVar32._4_4_ +
         auVar35._4_4_ * auVar35._4_4_ + auVar33._4_4_ * auVar33._4_4_;
    auVar64._8_4_ =
         auVar32._8_4_ * auVar32._8_4_ +
         auVar35._8_4_ * auVar35._8_4_ + auVar33._8_4_ * auVar33._8_4_;
    auVar64._12_4_ =
         auVar32._12_4_ * auVar32._12_4_ +
         auVar35._12_4_ * auVar35._12_4_ + auVar33._12_4_ * auVar33._12_4_;
    auVar95._0_4_ = (float)local_4d0._0_4_ * (float)local_4d0._0_4_ * fVar91;
    auVar95._4_4_ = (float)local_4d0._4_4_ * (float)local_4d0._4_4_ * fVar102;
    auVar95._8_4_ = fStack_4c8 * fStack_4c8 * fVar103;
    auVar95._12_4_ = fStack_4c4 * fStack_4c4 * fVar104;
    auVar32 = vcmpps_avx(auVar64,auVar95,1);
    auVar147._8_4_ = 0x7f800000;
    auVar147._0_8_ = 0x7f8000007f800000;
    auVar147._12_4_ = 0x7f800000;
    auVar96._0_4_ = fVar121 * -fVar145;
    auVar96._4_4_ = fVar127 * -fVar148;
    auVar96._8_4_ = fVar128 * -fVar149;
    auVar96._12_4_ = fVar129 * -fVar150;
    auVar35 = vblendvps_avx(auVar147,auVar96,auVar32);
    auVar32 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar58);
    local_3b0 = vblendvps_avx(auVar147,auVar35,auVar32);
    local_290._0_4_ = auVar59._0_4_;
    local_290._4_4_ = auVar59._4_4_;
    fStack_288 = auVar59._8_4_;
    fStack_284 = auVar59._12_4_;
    fVar145 = (float)local_290._0_4_ * fVar90 + fVar89 * auVar61._0_4_ + auVar69._0_4_ * fVar81;
    fVar148 = (float)local_290._4_4_ * fVar161 + fVar57 * auVar61._4_4_ + auVar69._4_4_ * fVar56;
    fVar149 = fStack_288 * fVar12 + fVar11 * auVar61._8_4_ + auVar69._8_4_ * fVar10;
    fVar150 = fStack_284 * fVar16 + fVar15 * auVar61._12_4_ + auVar69._12_4_ * fVar14;
    auVar97._0_4_ = auVar142._0_4_ * (float)local_290._0_4_;
    auVar97._4_4_ = auVar142._4_4_ * (float)local_290._4_4_;
    auVar97._8_4_ = auVar142._8_4_ * fStack_288;
    auVar97._12_4_ = auVar142._12_4_ * fStack_284;
    auVar35._0_4_ = auVar142._0_4_ * auVar61._0_4_;
    auVar35._4_4_ = auVar142._4_4_ * auVar61._4_4_;
    auVar35._8_4_ = auVar142._8_4_ * auVar61._8_4_;
    auVar35._12_4_ = auVar142._12_4_ * auVar61._12_4_;
    auVar75._0_4_ = auVar142._0_4_ * auVar69._0_4_;
    auVar75._4_4_ = auVar142._4_4_ * auVar69._4_4_;
    auVar75._8_4_ = auVar142._8_4_ * auVar69._8_4_;
    auVar75._12_4_ = auVar142._12_4_ * auVar69._12_4_;
    auVar111._0_4_ = (float)local_3e0._4_4_ * fVar145;
    auVar111._4_4_ = (float)local_3e0._4_4_ * fVar148;
    auVar111._8_4_ = (float)local_3e0._4_4_ * fVar149;
    auVar111._12_4_ = (float)local_3e0._4_4_ * fVar150;
    auVar32 = vsubps_avx(auVar97,auVar111);
    auVar112._0_4_ = local_240 * fVar145;
    auVar112._4_4_ = local_240 * fVar148;
    auVar112._8_4_ = local_240 * fVar149;
    auVar112._12_4_ = local_240 * fVar150;
    auVar35 = vsubps_avx(auVar35,auVar112);
    auVar113._0_4_ = local_2b0 * fVar145;
    auVar113._4_4_ = local_2b0 * fVar148;
    auVar113._8_4_ = local_2b0 * fVar149;
    auVar113._12_4_ = local_2b0 * fVar150;
    auVar33 = vsubps_avx(auVar75,auVar113);
    auVar36._0_4_ =
         auVar32._0_4_ * auVar32._0_4_ +
         auVar35._0_4_ * auVar35._0_4_ + auVar33._0_4_ * auVar33._0_4_;
    auVar36._4_4_ =
         auVar32._4_4_ * auVar32._4_4_ +
         auVar35._4_4_ * auVar35._4_4_ + auVar33._4_4_ * auVar33._4_4_;
    auVar36._8_4_ =
         auVar32._8_4_ * auVar32._8_4_ +
         auVar35._8_4_ * auVar35._8_4_ + auVar33._8_4_ * auVar33._8_4_;
    auVar36._12_4_ =
         auVar32._12_4_ * auVar32._12_4_ +
         auVar35._12_4_ * auVar35._12_4_ + auVar33._12_4_ * auVar33._12_4_;
    auVar76._0_4_ = auVar31._0_4_ * auVar31._0_4_ * fVar91;
    auVar76._4_4_ = auVar31._4_4_ * auVar31._4_4_ * fVar102;
    auVar76._8_4_ = auVar31._8_4_ * auVar31._8_4_ * fVar103;
    auVar76._12_4_ = auVar31._12_4_ * auVar31._12_4_ * fVar104;
    uVar21 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar98._4_4_ = uVar21;
    auVar98._0_4_ = uVar21;
    auVar98._8_4_ = uVar21;
    auVar98._12_4_ = uVar21;
    auVar32 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar58);
    auVar35 = vcmpps_avx(auVar36,auVar76,1);
    auVar49._0_4_ = fVar121 * -fVar145;
    auVar49._4_4_ = fVar127 * -fVar148;
    auVar49._8_4_ = fVar128 * -fVar149;
    auVar49._12_4_ = fVar129 * -fVar150;
    auVar35 = vblendvps_avx(auVar147,auVar49,auVar35);
    auVar32 = vblendvps_avx(auVar147,auVar35,auVar32);
    auVar46 = vminps_avx(local_3b0,auVar32);
    auVar35 = vmaxps_avx(local_3b0,auVar32);
    auVar31 = vminps_avx(local_2f0,auVar46);
    auVar32 = vcmpps_avx(auVar147,auVar35,0);
    auVar124._8_4_ = 0xff800000;
    auVar124._0_8_ = 0xff800000ff800000;
    auVar124._12_4_ = 0xff800000;
    auVar32 = vblendvps_avx(auVar35,auVar124,auVar32);
    auVar33 = vcmpps_avx(auVar31,auVar46,0);
    auVar35 = vcmpps_avx(auVar147,auVar46,0);
    auVar35 = vblendvps_avx(auVar46,auVar124,auVar35);
    auVar32 = vblendvps_avx(auVar35,auVar32,auVar33);
    local_190 = vmaxps_avx(local_420,auVar32);
    auVar50._0_4_ = fVar45 + auVar31._0_4_;
    auVar50._4_4_ = fVar55 + auVar31._4_4_;
    auVar50._8_4_ = fStack_488 + auVar31._8_4_;
    auVar50._12_4_ = fStack_484 + auVar31._12_4_;
    auVar32 = vcmpps_avx(auVar98,auVar50,2);
    uVar21 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar77._4_4_ = uVar21;
    auVar77._0_4_ = uVar21;
    auVar77._8_4_ = uVar21;
    auVar77._12_4_ = uVar21;
    auVar35 = vcmpps_avx(auVar50,auVar77,2);
    auVar32 = vandps_avx(auVar32,auVar35);
    auVar35 = vcmpps_avx(auVar147,auVar31,4);
    local_3a0 = vandps_avx(auVar32,auVar35);
    local_450._0_4_ = fVar45 + local_190._0_4_;
    local_450._4_4_ = fVar55 + local_190._4_4_;
    local_450._8_4_ = fStack_488 + local_190._8_4_;
    local_450._12_4_ = fStack_484 + local_190._12_4_;
    auVar32 = vcmpps_avx(auVar98,local_450,2);
    auVar35 = vcmpps_avx(local_450,auVar77,2);
    auVar32 = vandps_avx(auVar32,auVar35);
    auVar35 = vandps_avx(local_3a0,auVar58);
    auVar33 = vcmpps_avx(auVar124,local_190,4);
    auVar33 = vandps_avx(auVar58,auVar33);
    local_390 = vandps_avx(auVar32,auVar33);
    local_4b0 = vorps_avx(auVar35,local_390);
    if ((((local_4b0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_4b0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_4b0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_4b0[0xf] < '\0') {
      auVar33 = vblendvps_avx(local_190,auVar31,auVar35);
      _local_290 = auVar154;
      auVar46 = vblendvps_avx(auVar154,auVar123,auVar35);
      local_320._0_16_ = local_4b0;
      auVar19._4_4_ = fVar40;
      auVar19._0_4_ = fVar29;
      auVar19._8_4_ = fVar42;
      auVar19._12_4_ = fVar43;
      local_4d0._0_4_ = fVar29 * fVar54 * (float)local_4d0._0_4_;
      local_4d0._4_4_ = fVar40 * fVar9 * (float)local_4d0._4_4_;
      fStack_4c8 = fVar42 * fVar30 * fStack_4c8;
      fStack_4c4 = fVar43 * fVar41 * fStack_4c4;
      auVar32 = vcmpps_avx(local_2f0,auVar33,0);
      auVar35 = vcmpps_avx(auVar33,local_420,0);
      auVar32 = vorps_avx(auVar32,auVar35);
      auVar32 = vandps_avx(auVar58,auVar32);
      auVar35 = vcmpps_avx(auVar33,local_3b0,0);
      auVar35 = vandps_avx(auVar58,auVar35);
      fVar30 = auVar33._0_4_;
      fVar41 = auVar33._4_4_;
      fVar91 = auVar33._8_4_;
      fVar102 = auVar33._12_4_;
      local_1a0 = fVar90 * (float)local_4d0._0_4_;
      fStack_19c = fVar161 * (float)local_4d0._4_4_;
      fStack_198 = fVar12 * fStack_4c8;
      fStack_194 = fVar16 * fStack_4c4;
      auVar65._0_4_ =
           fVar90 * (float)local_4d0._0_4_ +
           (float)local_230._0_4_ * (fVar30 * (float)local_3e0._4_4_ + fVar151);
      auVar65._4_4_ =
           fVar161 * (float)local_4d0._4_4_ +
           (float)local_230._4_4_ * (fVar41 * (float)local_3e0._4_4_ + fVar156);
      auVar65._8_4_ = fVar12 * fStack_4c8 + fStack_228 * (fVar91 * (float)local_3e0._4_4_ + fVar157)
      ;
      auVar65._12_4_ =
           fVar16 * fStack_4c4 + fStack_224 * (fVar102 * (float)local_3e0._4_4_ + fVar158);
      local_1c0 = fVar90 * fVar73;
      fStack_1bc = fVar161 * fVar78;
      fStack_1b8 = fVar12 * fVar79;
      fStack_1b4 = fVar16 * fVar80;
      fVar54 = auVar46._0_4_;
      auVar125._0_4_ = fVar90 * fVar73 * fVar54;
      fVar90 = auVar46._4_4_;
      auVar125._4_4_ = fVar161 * fVar78 * fVar90;
      fVar161 = auVar46._8_4_;
      auVar125._8_4_ = fVar12 * fVar79 * fVar161;
      fVar9 = auVar46._12_4_;
      auVar125._12_4_ = fVar16 * fVar80 * fVar9;
      auVar46 = vsubps_avx(auVar65,auVar125);
      local_1b0 = fVar89 * (float)local_4d0._0_4_;
      fStack_1ac = fVar57 * (float)local_4d0._4_4_;
      fStack_1a8 = fVar11 * fStack_4c8;
      fStack_1a4 = fVar15 * fStack_4c4;
      auVar126._0_4_ =
           fVar89 * (float)local_4d0._0_4_ + (fVar30 * local_240 + fVar44) * (float)local_230._0_4_;
      auVar126._4_4_ =
           fVar57 * (float)local_4d0._4_4_ + (fVar41 * local_240 + fVar8) * (float)local_230._4_4_;
      auVar126._8_4_ = fVar11 * fStack_4c8 + (fVar91 * local_240 + fVar13) * fStack_228;
      auVar126._12_4_ = fVar15 * fStack_4c4 + (fVar102 * local_240 + fVar17) * fStack_224;
      fStack_27c = fVar57 * fVar78;
      local_280 = fVar89 * fVar73;
      fStack_278 = fVar11 * fVar79;
      fStack_274 = fVar15 * fVar80;
      auVar136._0_4_ = fVar89 * fVar73 * fVar54;
      auVar136._4_4_ = fVar57 * fVar78 * fVar90;
      auVar136._8_4_ = fVar11 * fVar79 * fVar161;
      auVar136._12_4_ = fVar15 * fVar80 * fVar9;
      local_1e0._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
      local_1e0._8_4_ = -fVar12;
      local_1e0._12_4_ = -fVar16;
      auVar33 = vblendvps_avx(auVar68,local_1e0,auVar35);
      auVar58 = vsubps_avx(auVar126,auVar136);
      local_350 = vblendvps_avx(auVar33,auVar46,auVar32);
      local_200._0_8_ = local_260._0_8_ ^ 0x8000000080000000;
      local_200._8_4_ = -fVar11;
      local_200._12_4_ = -fVar15;
      auVar33 = vblendvps_avx(local_260,local_200,auVar35);
      local_340 = vblendvps_avx(auVar33,auVar58,auVar32);
      auVar33 = vrcpps_avx(auVar19);
      local_2e0 = auVar33._0_4_;
      auVar71._0_4_ = local_2e0 * fVar29;
      fStack_2dc = auVar33._4_4_;
      auVar71._4_4_ = fStack_2dc * fVar40;
      fStack_2d8 = auVar33._8_4_;
      auVar71._8_4_ = fStack_2d8 * fVar42;
      fStack_2d4 = auVar33._12_4_;
      auVar71._12_4_ = fStack_2d4 * fVar43;
      auVar143._8_4_ = 0x3f800000;
      auVar143._0_8_ = 0x3f8000003f800000;
      auVar143._12_4_ = 0x3f800000;
      auVar33 = vsubps_avx(auVar143,auVar71);
      local_2e0 = local_2e0 + local_2e0 * auVar33._0_4_;
      fStack_2dc = fStack_2dc + fStack_2dc * auVar33._4_4_;
      fStack_2d8 = fStack_2d8 + fStack_2d8 * auVar33._8_4_;
      fStack_2d4 = fStack_2d4 + fStack_2d4 * auVar33._12_4_;
      local_1d0 = fVar81 * (float)local_4d0._0_4_;
      fStack_1cc = fVar56 * (float)local_4d0._4_4_;
      fStack_1c8 = fVar10 * fStack_4c8;
      fStack_1c4 = fVar14 * fStack_4c4;
      auVar72._0_4_ =
           fVar81 * (float)local_4d0._0_4_ + (float)local_230._0_4_ * (fVar130 + local_2b0 * fVar30)
      ;
      auVar72._4_4_ =
           fVar56 * (float)local_4d0._4_4_ + (float)local_230._4_4_ * (fVar138 + local_2b0 * fVar41)
      ;
      auVar72._8_4_ = fVar10 * fStack_4c8 + fStack_228 * (fVar139 + local_2b0 * fVar91);
      auVar72._12_4_ = fVar14 * fStack_4c4 + fStack_224 * (fVar140 + local_2b0 * fVar102);
      local_270 = fVar81 * fVar73;
      fStack_26c = fVar56 * fVar78;
      fStack_268 = fVar10 * fVar79;
      fStack_264 = fVar14 * fVar80;
      auVar83._0_4_ = fVar54 * fVar81 * fVar73;
      auVar83._4_4_ = fVar90 * fVar56 * fVar78;
      auVar83._8_4_ = fVar161 * fVar10 * fVar79;
      auVar83._12_4_ = fVar9 * fVar14 * fVar80;
      auVar46 = vsubps_avx(auVar72,auVar83);
      local_210._0_8_ = local_2c0._0_8_ ^ 0x8000000080000000;
      local_210._8_4_ = -fVar10;
      local_210._12_4_ = -fVar14;
      auVar33 = vblendvps_avx(local_2c0,local_210,auVar35);
      local_330 = vblendvps_avx(auVar33,auVar46,auVar32);
      local_1f0 = vandnps_avx(auVar35,auVar143);
      auVar51._0_4_ = fVar54 * local_2e0;
      auVar51._4_4_ = fVar90 * fStack_2dc;
      auVar51._8_4_ = fVar161 * fStack_2d8;
      auVar51._12_4_ = fVar9 * fStack_2d4;
      local_380 = vblendvps_avx(local_1f0,auVar51,auVar32);
      auVar37._0_4_ = fVar30 + fVar45;
      auVar37._4_4_ = fVar41 + fVar55;
      auVar37._8_4_ = fVar91 + fStack_488;
      auVar37._12_4_ = fVar102 + fStack_484;
      local_370 = ZEXT816(0) << 0x20;
      local_360 = auVar37;
      auVar99._8_4_ = 0x7f800000;
      auVar99._0_8_ = 0x7f8000007f800000;
      auVar99._12_4_ = 0x7f800000;
      auVar101 = ZEXT1664(auVar99);
      auVar32 = vblendvps_avx(auVar99,auVar37,local_4b0);
      auVar35 = vshufps_avx(auVar32,auVar32,0xb1);
      auVar35 = vminps_avx(auVar35,auVar32);
      auVar33 = vshufpd_avx(auVar35,auVar35,1);
      auVar35 = vminps_avx(auVar33,auVar35);
      auVar32 = vcmpps_avx(auVar32,auVar35,0);
      auVar33 = local_4b0 & auVar32;
      auVar35 = vpcmpeqd_avx(auVar35,auVar35);
      auVar120 = ZEXT1664(_local_3e0);
      auVar155 = ZEXT1664(CONCAT412(local_2b0,CONCAT48(local_2b0,CONCAT44(local_2b0,local_2b0))));
      auVar115 = ZEXT1664(local_260);
      auVar88 = ZEXT1664(local_2c0);
      auVar144 = ZEXT1664(_local_440);
      auVar160 = ZEXT1664(local_2d0);
      if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0'
         ) {
        auVar35 = auVar32;
      }
      auVar32 = vandps_avx(local_4b0,auVar35);
      uVar24 = vmovmskps_avx(auVar32);
      lVar27 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
        }
      }
      uVar24 = 1 << ((byte)k & 0x1f);
      pauVar26 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar24 >> 4) * 0x10);
      auVar66 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar137 = ZEXT3264(auVar66);
      local_498 = context;
      local_430 = pSVar25;
      local_428 = ray;
      while( true ) {
        auVar33 = auVar115._0_16_;
        auVar35 = auVar101._0_16_;
        local_3f0 = &local_180;
        local_410 = local_480;
        auVar46 = auVar120._0_16_;
        auVar58 = auVar144._0_16_;
        auVar31 = auVar155._0_16_;
        auVar32 = auVar88._0_16_;
        uVar1 = *(uint *)(local_220 + lVar27 * 4);
        pRVar22 = (RayHitK<8> *)(ulong)uVar1;
        pGVar5 = (pSVar25->geometries).items[(long)pRVar22].ptr;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_4b0 + lVar27 * 4) = 0;
        }
        else {
          auVar47 = auVar160._0_16_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar21 = *(undefined4 *)(local_380 + lVar27 * 4);
            uVar20 = *(undefined4 *)(local_370 + lVar27 * 4);
            uVar2 = *(uint *)(local_360 + lVar27 * 4);
            *(uint *)(ray + k * 4 + 0x100) = uVar2;
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_350 + lVar27 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_340 + lVar27 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_330 + lVar27 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar21;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar20;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[lVar27];
            *(uint *)(ray + k * 4 + 0x240) = uVar1;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            uVar21 = 0;
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_00eed2b7;
          }
          local_120 = *(undefined4 *)(local_380 + lVar27 * 4);
          local_100 = *(undefined4 *)(local_370 + lVar27 * 4);
          local_e0 = (line->primIDs).field_0.i[lVar27];
          local_180._4_4_ = *(undefined4 *)(local_350 + lVar27 * 4);
          uVar21 = *(undefined4 *)(local_340 + lVar27 * 4);
          local_160._4_4_ = uVar21;
          local_160._0_4_ = uVar21;
          local_160._8_4_ = uVar21;
          local_160._12_4_ = uVar21;
          local_160._16_4_ = uVar21;
          local_160._20_4_ = uVar21;
          local_160._24_4_ = uVar21;
          local_160._28_4_ = uVar21;
          auStack_b0 = vpshufd_avx(ZEXT416(uVar1),0);
          local_140._4_4_ = *(undefined4 *)(local_330 + lVar27 * 4);
          local_180._0_4_ = local_180._4_4_;
          local_180._8_4_ = local_180._4_4_;
          local_180._12_4_ = local_180._4_4_;
          local_180._16_4_ = local_180._4_4_;
          local_180._20_4_ = local_180._4_4_;
          local_180._24_4_ = local_180._4_4_;
          local_180._28_4_ = local_180._4_4_;
          local_140._0_4_ = local_140._4_4_;
          local_140._8_4_ = local_140._4_4_;
          local_140._12_4_ = local_140._4_4_;
          local_140._16_4_ = local_140._4_4_;
          local_140._20_4_ = local_140._4_4_;
          local_140._24_4_ = local_140._4_4_;
          local_140._28_4_ = local_140._4_4_;
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          uVar1 = *(uint *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + lVar27 * 4);
          local_480 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar24 & 0xf) << 4));
          local_470 = *pauVar26;
          local_408 = pGVar5->userPtr;
          local_400 = context->user;
          local_3e8 = 8;
          pRVar22 = (RayHitK<8> *)pGVar5->intersectionFilterN;
          local_490 = pauVar26;
          local_3f8 = ray;
          auVar32 = ZEXT416(uVar1);
          if (pRVar22 != (RayHitK<8> *)0x0) {
            local_2a0 = ZEXT416(uVar1);
            local_320 = auVar137._0_32_;
            pRVar22 = (RayHitK<8> *)(*(code *)pRVar22)(&local_410);
            auVar137 = ZEXT3264(local_320);
            auVar160 = ZEXT1664(local_2d0);
            auVar144 = ZEXT1664(_local_440);
            auVar88 = ZEXT1664(local_2c0);
            auVar115 = ZEXT1664(local_260);
            auVar155 = ZEXT1664(CONCAT412(fStack_2a4,
                                          CONCAT48(fStack_2a8,CONCAT44(fStack_2ac,local_2b0))));
            auVar120 = ZEXT1664(_local_3e0);
            auVar101 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            context = local_498;
            ray = local_428;
            pSVar25 = local_430;
            auVar32 = local_2a0;
          }
          auVar35 = vpcmpeqd_avx(local_480,ZEXT816(0) << 0x40);
          auVar33 = vpcmpeqd_avx(local_470,ZEXT816(0) << 0x40);
          auVar66._16_16_ = auVar33;
          auVar66._0_16_ = auVar35;
          auVar66 = auVar137._0_32_ & ~auVar66;
          if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar66 >> 0x7f,0) == '\0') &&
                (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar66 >> 0xbf,0) == '\0') &&
              (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar66[0x1f]) {
            auVar38._0_4_ = auVar137._0_4_ ^ auVar35._0_4_;
            auVar38._4_4_ = auVar137._4_4_ ^ auVar35._4_4_;
            auVar38._8_4_ = auVar137._8_4_ ^ auVar35._8_4_;
            auVar38._12_4_ = auVar137._12_4_ ^ auVar35._12_4_;
            auVar38._16_4_ = auVar137._16_4_ ^ auVar33._0_4_;
            auVar38._20_4_ = auVar137._20_4_ ^ auVar33._4_4_;
            auVar38._24_4_ = auVar137._24_4_ ^ auVar33._8_4_;
            auVar38._28_4_ = auVar137._28_4_ ^ auVar33._12_4_;
            pauVar26 = local_490;
          }
          else {
            pRVar22 = (RayHitK<8> *)context->args->filter;
            if ((pRVar22 != (RayHitK<8> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              local_320 = auVar137._0_32_;
              local_2a0 = auVar32;
              pRVar22 = (RayHitK<8> *)(*(code *)pRVar22)(&local_410);
              auVar137 = ZEXT3264(local_320);
              auVar160 = ZEXT1664(local_2d0);
              auVar144 = ZEXT1664(_local_440);
              auVar88 = ZEXT1664(local_2c0);
              auVar115 = ZEXT1664(local_260);
              auVar155 = ZEXT1664(CONCAT412(fStack_2a4,
                                            CONCAT48(fStack_2a8,CONCAT44(fStack_2ac,local_2b0))));
              auVar120 = ZEXT1664(_local_3e0);
              auVar101 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              context = local_498;
              pSVar25 = local_430;
              auVar32 = local_2a0;
            }
            auVar35 = vpcmpeqd_avx(local_480,ZEXT816(0) << 0x40);
            auVar33 = vpcmpeqd_avx(local_470,ZEXT816(0) << 0x40);
            auVar52._16_16_ = auVar33;
            auVar52._0_16_ = auVar35;
            auVar38._0_4_ = auVar137._0_4_ ^ auVar35._0_4_;
            auVar38._4_4_ = auVar137._4_4_ ^ auVar35._4_4_;
            auVar38._8_4_ = auVar137._8_4_ ^ auVar35._8_4_;
            auVar38._12_4_ = auVar137._12_4_ ^ auVar35._12_4_;
            auVar38._16_4_ = auVar137._16_4_ ^ auVar33._0_4_;
            auVar38._20_4_ = auVar137._20_4_ ^ auVar33._4_4_;
            auVar38._24_4_ = auVar137._24_4_ ^ auVar33._8_4_;
            auVar38._28_4_ = auVar137._28_4_ ^ auVar33._12_4_;
            auVar66 = auVar137._0_32_ & ~auVar52;
            pauVar26 = local_490;
            if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar66 >> 0x7f,0) != '\0') ||
                  (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0xbf,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar66[0x1f] < '\0') {
              auVar66 = vmaskmovps_avx(auVar38,*local_3f0);
              *(undefined1 (*) [32])(local_3f8 + 0x180) = auVar66;
              auVar66 = vmaskmovps_avx(auVar38,local_3f0[1]);
              *(undefined1 (*) [32])(local_3f8 + 0x1a0) = auVar66;
              auVar66 = vmaskmovps_avx(auVar38,local_3f0[2]);
              *(undefined1 (*) [32])(local_3f8 + 0x1c0) = auVar66;
              auVar66 = vmaskmovps_avx(auVar38,local_3f0[3]);
              *(undefined1 (*) [32])(local_3f8 + 0x1e0) = auVar66;
              auVar66 = vmaskmovps_avx(auVar38,local_3f0[4]);
              *(undefined1 (*) [32])(local_3f8 + 0x200) = auVar66;
              auVar66 = vmaskmovps_avx(auVar38,local_3f0[5]);
              *(undefined1 (*) [32])(local_3f8 + 0x220) = auVar66;
              auVar66 = vmaskmovps_avx(auVar38,local_3f0[6]);
              *(undefined1 (*) [32])(local_3f8 + 0x240) = auVar66;
              auVar66 = vmaskmovps_avx(auVar38,local_3f0[7]);
              *(undefined1 (*) [32])(local_3f8 + 0x260) = auVar66;
              auVar66 = vmaskmovps_avx(auVar38,local_3f0[8]);
              *(undefined1 (*) [32])(local_3f8 + 0x280) = auVar66;
              pRVar22 = local_3f8;
            }
          }
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar38 >> 0x7f,0) == '\0') &&
                (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar38 >> 0xbf,0) == '\0') &&
              (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar38[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = auVar32._0_4_;
          }
          else {
            auVar32 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_4b0 + lVar27 * 4) = 0;
          auVar32 = vshufps_avx(auVar32,auVar32,0);
          auVar32 = vcmpps_avx(auVar37,auVar32,2);
          local_4b0 = vandps_avx(auVar32,local_4b0);
        }
        uVar21 = (undefined4)((ulong)pRVar22 >> 0x20);
        auVar33 = auVar115._0_16_;
        auVar35 = auVar101._0_16_;
        auVar46 = auVar120._0_16_;
        auVar58 = auVar144._0_16_;
        auVar31 = auVar155._0_16_;
        auVar32 = auVar88._0_16_;
        if ((((local_4b0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_4b0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_4b0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_4b0[0xf]) break;
        auVar32 = vblendvps_avx(auVar35,auVar37,local_4b0);
        auVar35 = vshufps_avx(auVar32,auVar32,0xb1);
        auVar35 = vminps_avx(auVar35,auVar32);
        auVar33 = vshufpd_avx(auVar35,auVar35,1);
        auVar35 = vminps_avx(auVar33,auVar35);
        auVar35 = vcmpps_avx(auVar32,auVar35,0);
        auVar33 = local_4b0 & auVar35;
        auVar32 = local_4b0;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar33[0xf] < '\0') {
          auVar32 = vandps_avx(auVar35,local_4b0);
        }
        uVar20 = vmovmskps_avx(auVar32);
        lVar27 = 0;
        if (CONCAT44(uVar21,uVar20) != 0) {
          for (; (CONCAT44(uVar21,uVar20) >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
          }
        }
      }
      auVar47 = auVar160._0_16_;
      uVar2 = *(uint *)(ray + k * 4 + 0x100);
LAB_00eed2b7:
      auVar88 = ZEXT464(uVar2);
      auVar59 = vshufps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0);
      auVar59 = vcmpps_avx(local_450,auVar59,2);
      auVar59 = vandps_avx(auVar59,local_3a0);
      auVar60 = local_390 & auVar59;
      if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar60[0xf] < '\0'
         ) {
        auVar115 = ZEXT1664(auVar35);
        auVar60 = vcmpps_avx(local_190,local_3b0,0);
        auVar68 = vblendvps_avx(auVar68,local_1e0,auVar60);
        auVar33 = vblendvps_avx(auVar33,local_200,auVar60);
        auVar32 = vblendvps_avx(auVar32,local_210,auVar60);
        auVar60 = vcmpps_avx(local_190,local_2f0,0);
        auVar61 = vcmpps_avx(local_190,local_420,0);
        auVar60 = vorps_avx(auVar60,auVar61);
        fVar81 = local_190._0_4_;
        fVar89 = local_190._4_4_;
        fVar90 = local_190._8_4_;
        fVar44 = local_190._12_4_;
        auVar84._0_4_ =
             (float)local_230._0_4_ * (auVar46._0_4_ * fVar81 + (float)local_250._0_4_) + local_1a0;
        auVar84._4_4_ =
             (float)local_230._4_4_ * (auVar46._4_4_ * fVar89 + (float)local_250._4_4_) + fStack_19c
        ;
        auVar84._8_4_ = fStack_228 * (auVar46._8_4_ * fVar90 + fStack_248) + fStack_198;
        auVar84._12_4_ = fStack_224 * (auVar46._12_4_ * fVar44 + fStack_244) + fStack_194;
        auVar100._0_4_ = (float)local_230._0_4_ * (auVar58._0_4_ + fVar81 * local_240) + local_1b0;
        auVar100._4_4_ = (float)local_230._4_4_ * (auVar58._4_4_ + fVar89 * fStack_23c) + fStack_1ac
        ;
        auVar100._8_4_ = fStack_228 * (auVar58._8_4_ + fVar90 * fStack_238) + fStack_1a8;
        auVar100._12_4_ = fStack_224 * (auVar58._12_4_ + fVar44 * fStack_234) + fStack_1a4;
        auVar114._0_4_ =
             (float)local_230._0_4_ * (auVar47._0_4_ + auVar31._0_4_ * fVar81) + local_1d0;
        auVar114._4_4_ =
             (float)local_230._4_4_ * (auVar47._4_4_ + auVar31._4_4_ * fVar89) + fStack_1cc;
        auVar114._8_4_ = fStack_228 * (auVar47._8_4_ + auVar31._8_4_ * fVar90) + fStack_1c8;
        auVar114._12_4_ = fStack_224 * (auVar47._12_4_ + auVar31._12_4_ * fVar44) + fStack_1c4;
        auVar119._0_4_ = (float)local_290._0_4_ * local_1c0;
        auVar119._4_4_ = (float)local_290._4_4_ * fStack_1bc;
        auVar119._8_4_ = fStack_288 * fStack_1b8;
        auVar119._12_4_ = fStack_284 * fStack_1b4;
        auVar46 = vsubps_avx(auVar84,auVar119);
        local_350 = vblendvps_avx(auVar68,auVar46,auVar60);
        auVar85._0_4_ = (float)local_290._0_4_ * local_280;
        auVar85._4_4_ = (float)local_290._4_4_ * fStack_27c;
        auVar85._8_4_ = fStack_288 * fStack_278;
        auVar85._12_4_ = fStack_284 * fStack_274;
        auVar68 = vsubps_avx(auVar100,auVar85);
        local_340 = vblendvps_avx(auVar33,auVar68,auVar60);
        auVar86._0_4_ = (float)local_290._0_4_ * local_270;
        auVar86._4_4_ = (float)local_290._4_4_ * fStack_26c;
        auVar86._8_4_ = fStack_288 * fStack_268;
        auVar86._12_4_ = fStack_284 * fStack_264;
        auVar68 = vsubps_avx(auVar114,auVar86);
        local_330 = vblendvps_avx(auVar32,auVar68,auVar60);
        auVar87._0_4_ = (float)local_290._0_4_ * local_2e0;
        auVar87._4_4_ = (float)local_290._4_4_ * fStack_2dc;
        auVar87._8_4_ = fStack_288 * fStack_2d8;
        auVar87._12_4_ = fStack_284 * fStack_2d4;
        local_380 = vblendvps_avx(local_1f0,auVar87,auVar60);
        local_4b0 = vandps_avx(local_390,auVar59);
        auVar101 = ZEXT464(0) << 0x20;
        local_370 = ZEXT416(0) << 0x20;
        local_360 = local_450;
        auVar32 = vblendvps_avx(auVar35,local_450,local_4b0);
        auVar35 = vshufps_avx(auVar32,auVar32,0xb1);
        auVar35 = vminps_avx(auVar35,auVar32);
        auVar68 = vshufpd_avx(auVar35,auVar35,1);
        auVar35 = vminps_avx(auVar68,auVar35);
        auVar35 = vcmpps_avx(auVar32,auVar35,0);
        pSVar25 = context->scene;
        auVar68 = local_4b0 & auVar35;
        auVar32 = local_4b0;
        if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar68[0xf] < '\0') {
          auVar32 = vandps_avx(auVar35,local_4b0);
        }
        uVar20 = vmovmskps_avx(auVar32);
        lVar27 = 0;
        if (CONCAT44(uVar21,uVar20) != 0) {
          for (; (CONCAT44(uVar21,uVar20) >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
          }
        }
        auVar66 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar120 = ZEXT3264(auVar66);
        do {
          local_3f0 = &local_180;
          local_410 = local_480;
          uVar1 = *(uint *)(local_220 + lVar27 * 4);
          pRVar22 = (RayHitK<8> *)(ulong)uVar1;
          pGVar5 = (pSVar25->geometries).items[(long)pRVar22].ptr;
          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_4b0 + lVar27 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar21 = *(undefined4 *)(local_380 + lVar27 * 4);
              uVar20 = *(undefined4 *)(local_370 + lVar27 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + lVar27 * 4);
              *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_350 + lVar27 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_340 + lVar27 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_330 + lVar27 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar21;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar20;
              *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[lVar27];
              *(uint *)(ray + k * 4 + 0x240) = uVar1;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_120 = *(undefined4 *)(local_380 + lVar27 * 4);
            local_100 = *(undefined4 *)(local_370 + lVar27 * 4);
            auStack_b0 = vpshufd_avx(ZEXT416(uVar1),0);
            local_e0 = (line->primIDs).field_0.i[lVar27];
            uVar21 = *(undefined4 *)(local_350 + lVar27 * 4);
            local_180._4_4_ = uVar21;
            local_180._0_4_ = uVar21;
            local_180._8_4_ = uVar21;
            local_180._12_4_ = uVar21;
            local_180._16_4_ = uVar21;
            local_180._20_4_ = uVar21;
            local_180._24_4_ = uVar21;
            local_180._28_4_ = uVar21;
            uVar21 = *(undefined4 *)(local_340 + lVar27 * 4);
            local_160._4_4_ = uVar21;
            local_160._0_4_ = uVar21;
            local_160._8_4_ = uVar21;
            local_160._12_4_ = uVar21;
            local_160._16_4_ = uVar21;
            local_160._20_4_ = uVar21;
            local_160._24_4_ = uVar21;
            local_160._28_4_ = uVar21;
            uVar21 = *(undefined4 *)(local_330 + lVar27 * 4);
            local_140._4_4_ = uVar21;
            local_140._0_4_ = uVar21;
            local_140._8_4_ = uVar21;
            local_140._12_4_ = uVar21;
            local_140._16_4_ = uVar21;
            local_140._20_4_ = uVar21;
            local_140._24_4_ = uVar21;
            local_140._28_4_ = uVar21;
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            uStack_fc = local_100;
            uStack_f8 = local_100;
            uStack_f4 = local_100;
            uStack_f0 = local_100;
            uStack_ec = local_100;
            uStack_e8 = local_100;
            uStack_e4 = local_100;
            uStack_dc = local_e0;
            uStack_d8 = local_e0;
            uStack_d4 = local_e0;
            uStack_d0 = local_e0;
            uStack_cc = local_e0;
            uStack_c8 = local_e0;
            uStack_c4 = local_e0;
            local_c0 = auStack_b0;
            _local_3e0 = auVar120._0_32_;
            uStack_9c = context->user->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = context->user->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + lVar27 * 4);
            local_480 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar24 & 0xf) << 4));
            local_470 = *pauVar26;
            local_408 = pGVar5->userPtr;
            local_400 = context->user;
            local_3e8 = 8;
            pRVar22 = (RayHitK<8> *)pGVar5->intersectionFilterN;
            local_490 = pauVar26;
            local_3f8 = ray;
            if (pRVar22 != (RayHitK<8> *)0x0) {
              pRVar22 = (RayHitK<8> *)(*(code *)pRVar22)(&local_410);
              auVar120 = ZEXT3264(_local_3e0);
              auVar101 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar88 = ZEXT1664(auVar88._0_16_);
              context = local_498;
              ray = local_428;
            }
            auVar32 = vpcmpeqd_avx(local_480,auVar101._0_16_);
            auVar35 = vpcmpeqd_avx(local_470,auVar101._0_16_);
            auVar67._16_16_ = auVar35;
            auVar67._0_16_ = auVar32;
            _local_3e0 = auVar120._0_32_;
            auVar66 = _local_3e0 & ~auVar67;
            if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar66 >> 0x7f,0) == '\0') &&
                  (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar66 >> 0xbf,0) == '\0') &&
                (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar66[0x1f]) {
              auVar39._0_4_ = auVar120._0_4_ ^ auVar32._0_4_;
              auVar39._4_4_ = auVar120._4_4_ ^ auVar32._4_4_;
              auVar39._8_4_ = auVar120._8_4_ ^ auVar32._8_4_;
              auVar39._12_4_ = auVar120._12_4_ ^ auVar32._12_4_;
              auVar39._16_4_ = auVar120._16_4_ ^ auVar35._0_4_;
              auVar39._20_4_ = auVar120._20_4_ ^ auVar35._4_4_;
              auVar39._24_4_ = auVar120._24_4_ ^ auVar35._8_4_;
              auVar39._28_4_ = auVar120._28_4_ ^ auVar35._12_4_;
              auVar115 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              pauVar26 = local_490;
            }
            else {
              pRVar22 = (RayHitK<8> *)context->args->filter;
              if ((pRVar22 != (RayHitK<8> *)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                pRVar22 = (RayHitK<8> *)(*(code *)pRVar22)(&local_410);
                auVar120 = ZEXT3264(_local_3e0);
                auVar101 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar88 = ZEXT1664(auVar88._0_16_);
                context = local_498;
              }
              auVar32 = vpcmpeqd_avx(local_480,auVar101._0_16_);
              auVar35 = vpcmpeqd_avx(local_470,auVar101._0_16_);
              auVar53._16_16_ = auVar35;
              auVar53._0_16_ = auVar32;
              auVar39._0_4_ = auVar120._0_4_ ^ auVar32._0_4_;
              auVar39._4_4_ = auVar120._4_4_ ^ auVar32._4_4_;
              auVar39._8_4_ = auVar120._8_4_ ^ auVar32._8_4_;
              auVar39._12_4_ = auVar120._12_4_ ^ auVar32._12_4_;
              auVar39._16_4_ = auVar120._16_4_ ^ auVar35._0_4_;
              auVar39._20_4_ = auVar120._20_4_ ^ auVar35._4_4_;
              auVar39._24_4_ = auVar120._24_4_ ^ auVar35._8_4_;
              auVar39._28_4_ = auVar120._28_4_ ^ auVar35._12_4_;
              auVar66 = auVar120._0_32_ & ~auVar53;
              auVar115 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              pauVar26 = local_490;
              if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar66 >> 0x7f,0) != '\0') ||
                    (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar66 >> 0xbf,0) != '\0') ||
                  (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar66[0x1f] < '\0') {
                auVar66 = vmaskmovps_avx(auVar39,*local_3f0);
                *(undefined1 (*) [32])(local_3f8 + 0x180) = auVar66;
                auVar66 = vmaskmovps_avx(auVar39,local_3f0[1]);
                *(undefined1 (*) [32])(local_3f8 + 0x1a0) = auVar66;
                auVar66 = vmaskmovps_avx(auVar39,local_3f0[2]);
                *(undefined1 (*) [32])(local_3f8 + 0x1c0) = auVar66;
                auVar66 = vmaskmovps_avx(auVar39,local_3f0[3]);
                *(undefined1 (*) [32])(local_3f8 + 0x1e0) = auVar66;
                auVar66 = vmaskmovps_avx(auVar39,local_3f0[4]);
                *(undefined1 (*) [32])(local_3f8 + 0x200) = auVar66;
                auVar66 = vmaskmovps_avx(auVar39,local_3f0[5]);
                *(undefined1 (*) [32])(local_3f8 + 0x220) = auVar66;
                auVar66 = vmaskmovps_avx(auVar39,local_3f0[6]);
                *(undefined1 (*) [32])(local_3f8 + 0x240) = auVar66;
                auVar66 = vmaskmovps_avx(auVar39,local_3f0[7]);
                *(undefined1 (*) [32])(local_3f8 + 0x260) = auVar66;
                auVar66 = vmaskmovps_avx(auVar39,local_3f0[8]);
                *(undefined1 (*) [32])(local_3f8 + 0x280) = auVar66;
                pRVar22 = local_3f8;
              }
            }
            if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar39 >> 0x7f,0) == '\0') &&
                  (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar39 >> 0xbf,0) == '\0') &&
                (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar39[0x1f]) {
              *(int *)(ray + k * 4 + 0x100) = auVar88._0_4_;
            }
            else {
              auVar88 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
            }
            *(undefined4 *)(local_4b0 + lVar27 * 4) = 0;
            auVar32 = vshufps_avx(auVar88._0_16_,auVar88._0_16_,0);
            auVar32 = vcmpps_avx(local_450,auVar32,2);
            local_4b0 = vandps_avx(auVar32,local_4b0);
          }
          if ((((local_4b0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_4b0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_4b0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_4b0[0xf]) {
            return;
          }
          auVar32 = vblendvps_avx(auVar115._0_16_,local_450,local_4b0);
          auVar35 = vshufps_avx(auVar32,auVar32,0xb1);
          auVar35 = vminps_avx(auVar35,auVar32);
          auVar68 = vshufpd_avx(auVar35,auVar35,1);
          auVar35 = vminps_avx(auVar68,auVar35);
          auVar35 = vcmpps_avx(auVar32,auVar35,0);
          auVar68 = local_4b0 & auVar35;
          auVar32 = local_4b0;
          if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar68[0xf] < '\0') {
            auVar32 = vandps_avx(auVar35,local_4b0);
          }
          uVar21 = vmovmskps_avx(auVar32);
          uVar23 = CONCAT44((int)((ulong)pRVar22 >> 0x20),uVar21);
          lVar27 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context,  const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }